

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> * __thiscall
testing::internal::TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
GetCurrentAction(TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *this,
                FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *mocker
                ,ArgumentTuple *args)

{
  size_type sVar1;
  ostream *args_00;
  char *pcVar2;
  ostream *os;
  ostream *poVar3;
  const_reference ppvVar4;
  Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *pAVar5;
  string *in_RDI;
  stringstream ss;
  int action_count;
  int count;
  string *in_stack_fffffffffffffd78;
  ExpectationBase *in_stack_fffffffffffffd80;
  int iVar6;
  char *in_stack_fffffffffffffd88;
  undefined8 in_stack_fffffffffffffd90;
  undefined1 condition;
  MutexBase *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  ostream *in_stack_fffffffffffffdc8;
  ExpectationBase *in_stack_fffffffffffffdd0;
  FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *this_00;
  undefined4 in_stack_fffffffffffffdf4;
  LogSeverity severity;
  string local_200 [32];
  stringstream local_1e0 [16];
  FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> local_1d0 [3];
  int local_58;
  allocator<char> local_41;
  string local_40 [36];
  int local_1c;
  
  condition = (undefined1)((ulong)in_stack_fffffffffffffd90 >> 0x38);
  MutexBase::AssertHeld(in_stack_fffffffffffffdb0);
  local_1c = ExpectationBase::call_count(in_stack_fffffffffffffd80);
  iVar6 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  severity = CONCAT13(0 < local_1c,(int3)in_stack_fffffffffffffdf4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  Assert((bool)condition,in_stack_fffffffffffffd88,iVar6,in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  sVar1 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                    ((vector<const_void_*,_std::allocator<const_void_*>_> *)
                     &in_RDI[4]._M_string_length);
  local_58 = (int)sVar1;
  if (((0 < local_58) && ((in_RDI[5].field_0x1 & 1) == 0)) && (local_58 < local_1c)) {
    std::__cxx11::stringstream::stringstream(local_1e0);
    this_00 = (FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)0x0;
    if (&stack0x00000000 != (undefined1 *)0x1e0) {
      this_00 = local_1d0;
    }
    ExpectationBase::DescribeLocationTo(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    args_00 = std::operator<<((ostream *)local_1d0,"Actions ran out in ");
    pcVar2 = ExpectationBase::source_text((ExpectationBase *)0x1d0470);
    os = std::operator<<(args_00,pcVar2);
    poVar3 = std::operator<<(os,"...\n");
    poVar3 = std::operator<<(poVar3,"Called ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_1c);
    poVar3 = std::operator<<(poVar3," times, but only ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_58);
    poVar3 = std::operator<<(poVar3," WillOnce()");
    pcVar2 = "s are";
    if (local_58 == 1) {
      pcVar2 = " is";
    }
    poVar3 = std::operator<<(poVar3,pcVar2);
    std::operator<<(poVar3," specified - ");
    FunctionMockerBase<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>::
    DescribeDefaultActionTo(this_00,(ArgumentTuple *)args_00,os);
    iVar6 = (int)((ulong)this_00 >> 0x20);
    std::__cxx11::stringstream::str();
    Log(severity,in_RDI,iVar6);
    std::__cxx11::string::~string(local_200);
    std::__cxx11::stringstream::~stringstream(local_1e0);
  }
  if (local_58 < local_1c) {
    pAVar5 = repeated_action((TypedExpectation<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)>
                              *)in_RDI);
  }
  else {
    ppvVar4 = std::vector<const_void_*,_std::allocator<const_void_*>_>::operator[]
                        ((vector<const_void_*,_std::allocator<const_void_*>_> *)
                         &in_RDI[4]._M_string_length,(long)(local_1c + -1));
    pAVar5 = (Action<BasicTestExpr<1>_(TestExprBuilder<1,_BasicTestExpr<1>_>)> *)*ppvVar4;
  }
  return pAVar5;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = call_count();
    Assert(count >= 1, __FILE__, __LINE__,
           "call_count() is <= 0 when GetCurrentAction() is "
           "called - this should never happen.");

    const int action_count = static_cast<int>(untyped_actions_.size());
    if (action_count > 0 && !repeated_action_specified_ &&
        count > action_count) {
      // If there is at least one WillOnce() and no WillRepeatedly(),
      // we warn the user when the WillOnce() clauses ran out.
      ::std::stringstream ss;
      DescribeLocationTo(&ss);
      ss << "Actions ran out in " << source_text() << "...\n"
         << "Called " << count << " times, but only "
         << action_count << " WillOnce()"
         << (action_count == 1 ? " is" : "s are") << " specified - ";
      mocker->DescribeDefaultActionTo(args, &ss);
      Log(kWarning, ss.str(), 1);
    }

    return count <= action_count ?
        *static_cast<const Action<F>*>(untyped_actions_[count - 1]) :
        repeated_action();
  }